

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwr.c
# Opt level: O0

void other_patches(dw_rom *rom)

{
  dw_rom *rom_local;
  
  printf("Applying various patches...\n");
  set_text(rom,0x8256,"Thou hast found a bug/ ");
  vpatch(rom,0x3f9e,2,0x37,0x32);
  vpatch(rom,0xaf6c,1,0xef);
  vpatch(rom,0x74e,1,0x6f);
  vpatch(rom,0x76c,1,0x6f);
  vpatch(rom,0x77a,1,0x46);
  vpatch(rom,0xe1dc,2,0xfd,0xe1);
  vpatch(rom,0xd383,2,0xd5,0xbf);
  vpatch(rom,0x3fd5,8,0x20,0x4b,0xe0,0xa9,7,0x4c,0x4b,0xe0);
  vpatch(rom,0xde23,10,0x29,7,0xaa,0xbd,0x54,0xf5,0xea,0xea,0xea,0xea);
  vpatch(rom,0x42a,1,0x47);
  vpatch(rom,0x2a9,1,0x45);
  vpatch(rom,0x2c7,1,0x66);
  vpatch(rom,0xf437,3,5,1,8);
  vpatch(rom,0xf4d0,3,4,1,7);
  set_dungeon_tile(rom,CHARLOCK_CAVE_6,'\t','\0','\x02');
  vpatch(rom,0xcebf,3,0x4c,4,0xcf);
  vpatch(rom,0xe74d,1,9);
  vpatch(rom,0xdbc1,1,0x12);
  vpatch(rom,0x18ee,1,0xa7);
  vpatch(rom,0x90f,1,0x6f);
  vpatch(rom,0x93c,1,0x6f);
  vpatch(rom,0x17a2,3,0,0);
  vpatch(rom,0xf131,2,0x69,3);
  set_text(rom,0xad85,"The spell had no effect");
  return;
}

Assistant:

static void other_patches(dw_rom *rom)
{
    printf("Applying various patches...\n");

    /* Replace "Thou cannot enter here.". If a player finds this, it's a bug */
    set_text(rom, 0x8256, "Thou hast found a bug/ ");

    /* convert PRG1 to PRG0 */
    vpatch(rom, 0x03f9e, 2,  0x37,  0x32);
    vpatch(rom, 0x0af6c, 1,  0xef);

    /* open the fairy water shop in breconnary */
    vpatch(rom, 0x0074e, 1,  0x6f);
    vpatch(rom, 0x0076c, 1,  0x6f);
    vpatch(rom, 0x0077a, 1,  0x46);

    /* make search actually open a chest */
    vpatch(rom, 0xe1dc, 2, 0xfd, 0xe1);

    /* Have the jerk take the token along with staff & stones */
    vpatch(rom, 0x0d383,    2,  0xd5,  0xbf); /* jump to new code below */
    vpatch(rom, 0x03fd5,    8,
            0x20,  0x4b,  0xe0, /* JSR $E04B ; replace the rewritten code    */
            0xa9,  0x07,        /* LDA #$07  ; remove token from inventory   */
            0x4c,  0x4b,  0xe0  /* JMP $E04B ; jump to remove code           */
    );

    vpatch(rom, 0xde23, 10, /* Changes the enemies summoned by the harp.     */
        0x29, 0x7,          /* AND #$07    ; limit the random number to 0-7  */
        0xaa,               /* TAX         ; move value to the X register    */
        0xbd, 0x54, 0xf5,   /* LDA #F554,X ; load a monster from zone 1-2    */
        0xea,               /* NOP         ; fill in the rest with NOP       */
        0xea,               /* NOP                                           */
        0xea,               /* NOP                                           */
        0xea                /* NOP                                           */
    );
    vpatch(rom, 0x42a, 1, 0x47);  /* add new stairs to the throne room */
    vpatch(rom, 0x2a9, 1, 0x45);  /* add new stairs to the 1st floor */
    vpatch(rom, 0x2c7, 1, 0x66);  /* add a new exit to the first floor */
    /* replace the charlock loop stairs with some for tantegel */
    vpatch(rom, 0xf437, 3, 5, 1, 8);
    vpatch(rom, 0xf4d0, 3, 4, 1, 7);
    set_dungeon_tile(rom, CHARLOCK_CAVE_6, 9, 0, DUNGEON_TILE_BRICK);
    /* Sets the encounter rate of Zone 0 to be the same as other zones. */
    vpatch(rom, 0xcebf, 3, 0x4c, 0x04, 0xcf);  /* skip over the zone 0 code */
    vpatch(rom, 0xe74d, 1, 9);  /* buff the hurt spell */
    vpatch(rom, 0xdbc1, 1, 18);  /* buff the heal spell */
    /* fixing some annoying roaming npcs */
    vpatch(rom, 0x18ee, 1, 0xa7); /* move the stupid old man from the item shop */
    vpatch(rom, 0x90f,  1, 0x6f); /* quit ignoring the customers */
    vpatch(rom, 0x93c,  1, 0x6f); /* quit ignoring the customers */
    vpatch(rom, 0x17a2, 3, 0, 0, 0); /* delete roaming throne room guard */
    vpatch(rom, 0xf131, 2, 0x69, 0x03); /* Lock the stat build modifier at 3 */

    /* I always hated this wording */
//     dwr_str_replace(rom, "The spell will not work", "The spell had no effect");
    set_text(rom, 0xad85,  "The spell had no effect");
}